

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linenoise.c
# Opt level: O2

void refreshMultiLine(linenoiseState *l,int flags)

{
  int __fd;
  char *pcVar1;
  ulong uVar2;
  bool bVar3;
  undefined4 uVar4;
  size_t sVar5;
  size_t ini_pos;
  size_t sVar6;
  int iVar7;
  ulong uVar8;
  int iVar9;
  int iVar10;
  uint i;
  abuf ab;
  char seq [64];
  
  pcVar1 = l->prompt;
  sVar5 = strlen(pcVar1);
  ini_pos = promptTextColumnLen(pcVar1,sVar5);
  sVar6 = columnPosForMultiLine(l->buf,l->len,l->len,l->cols,ini_pos);
  uVar8 = l->cols;
  iVar10 = (int)l->oldrows;
  __fd = l->ofd;
  iVar9 = (int)(((sVar6 + uVar8 + ini_pos) - 1) / uVar8);
  l->oldrows = (long)iVar9;
  ab.b = (char *)0x0;
  ab.len = 0;
  uVar2 = l->oldcollen;
  if (((uVar2 < l->len) && (l->pos <= uVar8 && l->pos == l->len)) &&
     (l->prev_history_index == l->history_index)) {
    pcVar1 = l->buf;
    sVar5 = strlen(pcVar1);
    abAppend(&ab,pcVar1 + uVar2,(int)sVar5 - (int)uVar2);
    pcVar1 = ab.b;
    l->oldcolpos = sVar6;
    l->oldcollen = l->len;
    write(__fd,ab.b,(long)ab.len);
    free(pcVar1);
    l->prev_history_index = l->history_index;
    return;
  }
  if ((flags & 1U) != 0) {
    if ((int)((uVar8 + ini_pos + l->oldcolpos) / uVar8) < iVar10) {
      snprintf(seq,0x40,"\x1b[%dB");
      sVar5 = strlen(seq);
      abAppend(&ab,seq,(int)sVar5);
    }
    iVar7 = 1;
    if (1 < iVar10) {
      iVar7 = iVar10;
    }
    while (iVar7 = iVar7 + -1, iVar7 != 0) {
      builtin_strncpy(seq,"\r\x1b[0K\x1b[1A",10);
      sVar5 = strlen(seq);
      abAppend(&ab,seq,(int)sVar5);
    }
  }
  if ((flags & 3U) != 0) {
    builtin_strncpy(seq,"\r\x1b[0K",6);
    uVar4 = seq._0_4_;
    seq._0_8_ = CONCAT44(seq._4_4_,uVar4);
    sVar5 = strlen(seq);
    abAppend(&ab,seq,(int)sVar5);
  }
  sVar6 = columnPosForMultiLine(l->buf,l->len,l->pos,l->cols,ini_pos);
  iVar10 = (int)sVar6;
  if ((flags & 2U) != 0) {
    pcVar1 = l->prompt;
    sVar5 = strlen(pcVar1);
    abAppend(&ab,pcVar1,(int)sVar5);
    if (maskmode == '\x01') {
      for (uVar8 = 0; uVar8 < l->len; uVar8 = (ulong)((int)uVar8 + 1)) {
        abAppend(&ab,"*",1);
      }
    }
    else {
      abAppend(&ab,l->buf,(int)l->len);
    }
    refreshShowHints(&ab,l,(int)ini_pos);
    if (((l->pos != 0) && (l->pos == l->len)) && (((long)iVar10 + ini_pos) % l->cols == 0)) {
      abAppend(&ab,"\n",1);
      seq[0] = '\r';
      seq[1] = '\0';
      sVar5 = strlen(seq);
      abAppend(&ab,seq,(int)sVar5);
      iVar7 = iVar9 + 1;
      bVar3 = (int)l->oldrows <= iVar9;
      iVar9 = iVar7;
      if (bVar3) {
        l->oldrows = (long)iVar7;
      }
    }
    uVar8 = l->cols;
    if ((int)((uVar8 + ini_pos + (long)iVar10) / uVar8) < iVar9) {
      snprintf(seq,0x40,"\x1b[%dA");
      sVar5 = strlen(seq);
      abAppend(&ab,seq,(int)sVar5);
      uVar8 = l->cols;
    }
    if ((int)((ini_pos + (long)iVar10) % uVar8) == 0) {
      seq[0] = '\r';
      seq[1] = '\0';
    }
    else {
      snprintf(seq,0x40,"\r\x1b[%dC");
    }
    sVar5 = strlen(seq);
    abAppend(&ab,seq,(int)sVar5);
  }
  pcVar1 = ab.b;
  l->oldcolpos = (long)iVar10;
  l->oldcollen = l->len;
  l->prev_history_index = l->history_index;
  write(__fd,ab.b,(long)ab.len);
  free(pcVar1);
  return;
}

Assistant:

static void refreshMultiLine(struct linenoiseState *l, int flags) {
    char seq[64];
    size_t pcollen = promptTextColumnLen(l->prompt,strlen(l->prompt));
    size_t colpos = columnPosForMultiLine(l->buf, l->len, l->len, l->cols, pcollen);
    int colpos2; /* cursor column position. */
    int rows = (pcollen+colpos+l->cols-1)/l->cols; /* rows used by current buf. */
    int rpos = (pcollen+l->oldcolpos+l->cols)/l->cols; /* cursor relative row. */
    int rpos2; /* rpos after refresh. */
    int col; /* column position, zero-based. */
    int old_rows = l->oldrows;
    int fd = l->ofd, j;
    struct abuf ab;

    l->oldrows = rows;

    /* First step: clear all the lines used before. To do so start by
     * going to the last row. */
    abInit(&ab);

    if ((l->oldcollen < l->len) && // some character was added
            (l->pos == l->len) && // at the end of the line
            (l->pos <= l->cols) && // no multiline break
            (l->prev_history_index == l->history_index) // no buffer change based on history
            ) {
        /* Ignore flags and just add one character.
         * This code was added because redundant ANSI escape codes make tcl-tests incapable.
         */
        abAppend(&ab,l->buf + l->oldcollen,strlen(l->buf) - l->oldcollen);
        l->oldcolpos = colpos;
        l->oldcollen = l->len;
        if (write(fd,ab.b,ab.len) == -1) {} /* Can't recover from write error. */
        abFree(&ab);
        l->prev_history_index = l->history_index;
        return;
    }

    if (flags & REFRESH_CLEAN) {
        if (old_rows-rpos > 0) {
            lndebug("go down %d", old_rows-rpos);
            snprintf(seq,64,"\x1b[%dB", old_rows-rpos);
            abAppend(&ab,seq,strlen(seq));
        }

        /* Now for every row clear it, go up. */
        for (j = 0; j < old_rows-1; j++) {
            lndebug("clear+up");
            snprintf(seq,64,"\r\x1b[0K\x1b[1A");
            abAppend(&ab,seq,strlen(seq));
        }
    }

    if (flags & REFRESH_ALL) {
        /* Clean the top line. */
        lndebug("clear");
        snprintf(seq,64,"\r\x1b[0K");
        abAppend(&ab,seq,strlen(seq));
    }

    /* Get column length to cursor position */
    colpos2 = columnPosForMultiLine(l->buf,l->len,l->pos,l->cols,pcollen);

    if (flags & REFRESH_WRITE) {
        /* Write the prompt and the current buffer content */
        abAppend(&ab,l->prompt,strlen(l->prompt));
        if (maskmode == 1) {
            unsigned int i;
            for (i = 0; i < l->len; i++) abAppend(&ab,"*",1);
        } else {
            abAppend(&ab,l->buf,l->len);
        }

        /* Show hits if any. */
        refreshShowHints(&ab,l,pcollen);

        /* If we are at the very end of the screen with our prompt, we need to
         * emit a newline and move the prompt to the first column. */
        if (l->pos &&
            l->pos == l->len &&
            (colpos2+pcollen) % l->cols == 0)
        {
            lndebug("<newline>");
            abAppend(&ab,"\n",1);
            snprintf(seq,64,"\r");
            abAppend(&ab,seq,strlen(seq));
            rows++;
            if (rows > (int)l->oldrows) l->oldrows = rows;
        }

        /* Move cursor to right position. */
        rpos2 = (pcollen+colpos2+l->cols)/l->cols; /* Current cursor relative row */
        lndebug("rpos2 %d", rpos2);

        /* Go up till we reach the expected position. */
        if (rows-rpos2 > 0) {
            lndebug("go-up %d", rows-rpos2);
            snprintf(seq,64,"\x1b[%dA", rows-rpos2);
            abAppend(&ab,seq,strlen(seq));
        }

        /* Set column. */
        col = (pcollen+colpos2) % l->cols;
        lndebug("set col %d", 1+col);
        if (col)
            snprintf(seq,64,"\r\x1b[%dC", col);
        else
            snprintf(seq,64,"\r");
        abAppend(&ab,seq,strlen(seq));
    }

    lndebug("\n");
    l->oldcolpos = colpos2;
    l->oldcollen = l->len;
    l->prev_history_index = l->history_index;

    if (write(fd,ab.b,ab.len) == -1) {} /* Can't recover from write error. */
    abFree(&ab);
}